

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O1

void cfd::UtxoUtil::ConvertToUtxo(UtxoData *utxo_data,Utxo *utxo,UtxoData *dest)

{
  undefined8 uVar1;
  _Base_ptr p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  Script SVar5;
  Script SVar6;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var7;
  undefined1 auVar8 [56];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  pointer pAVar18;
  AddressType AVar19;
  char cVar20;
  bool bVar21;
  int iVar22;
  uint64_t uVar23;
  long lVar24;
  pointer pAVar25;
  ulong uVar26;
  pointer pAVar27;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  Script *pSVar28;
  uint32_t txin_size;
  undefined4 uStack_924;
  undefined1 auStack_920 [16];
  uint32_t wit_size;
  undefined1 auStack_90c [20];
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> addr_prefixes;
  UtxoData *pUVar29;
  ByteData txid;
  ByteData block_hash;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  elements_prefixes;
  AddressFormatData local_888;
  void *local_848;
  code *local_830 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_7b8;
  Script local_7a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_760;
  Script local_730;
  Script local_6f8;
  Script local_6c0;
  Descriptor desc;
  UtxoData output;
  
  if (utxo != (Utxo *)0x0) {
    UtxoData::UtxoData(&output,utxo_data);
    memset(utxo,0,0xd8);
    utxo->block_height = utxo_data->block_height;
    utxo->vout = utxo_data->vout;
    utxo->binary_data = utxo_data->binary_data;
    uVar23 = cfd::core::Amount::GetSatoshiValue();
    utxo->amount = uVar23;
    cfd::core::BlockHash::GetData();
    cVar20 = cfd::core::ByteData::Empty();
    if (cVar20 == '\0') {
      cfd::core::ByteData::GetBytes();
      uVar10 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x0;
      uVar11 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x1;
      uVar12 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x2;
      uVar13 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x3;
      uVar14 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x4;
      uVar15 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x5;
      uVar16 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x6;
      uVar17 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x7;
      uVar1 = *(undefined8 *)
               &((elements_prefixes.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.
                super__Rb_tree_header._M_header;
      p_Var2 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.
               super__Rb_tree_header._M_header._M_left;
      *(_Base_ptr *)(utxo->block_hash + 0x10) =
           ((elements_prefixes.
             super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
             ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_parent;
      *(_Base_ptr *)(utxo->block_hash + 0x18) = p_Var2;
      utxo->block_hash[0] = uVar10;
      utxo->block_hash[1] = uVar11;
      utxo->block_hash[2] = uVar12;
      utxo->block_hash[3] = uVar13;
      utxo->block_hash[4] = uVar14;
      utxo->block_hash[5] = uVar15;
      utxo->block_hash[6] = uVar16;
      utxo->block_hash[7] = uVar17;
      *(undefined8 *)(utxo->block_hash + 8) = uVar1;
      if (elements_prefixes.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(elements_prefixes.
                        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    cfd::core::Txid::GetData();
    cVar20 = cfd::core::ByteData::Empty();
    if (cVar20 == '\0') {
      cfd::core::ByteData::GetBytes();
      uVar10 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x0;
      uVar11 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x1;
      uVar12 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x2;
      uVar13 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x3;
      uVar14 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x4;
      uVar15 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x5;
      uVar16 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x6;
      uVar17 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.field_0x7;
      uVar1 = *(undefined8 *)
               &((elements_prefixes.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.
                super__Rb_tree_header._M_header;
      p_Var2 = ((elements_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.
               super__Rb_tree_header._M_header._M_left;
      *(_Base_ptr *)(utxo->txid + 0x10) =
           ((elements_prefixes.
             super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
             ._M_impl.super__Vector_impl_data._M_start)->map_)._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_parent;
      *(_Base_ptr *)(utxo->txid + 0x18) = p_Var2;
      utxo->txid[0] = uVar10;
      utxo->txid[1] = uVar11;
      utxo->txid[2] = uVar12;
      utxo->txid[3] = uVar13;
      utxo->txid[4] = uVar14;
      utxo->txid[5] = uVar15;
      utxo->txid[6] = uVar16;
      utxo->txid[7] = uVar17;
      *(undefined8 *)(utxo->txid + 8) = uVar1;
      if (elements_prefixes.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(elements_prefixes.
                        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    if ((utxo_data->descriptor)._M_string_length == 0) {
      pAVar27 = (pointer)0x0;
      pAVar25 = (pointer)0x0;
    }
    else {
      cfd::core::GetBitcoinAddressFormatList();
      cVar20 = cfd::core::ConfidentialAssetId::IsEmpty();
      if (cVar20 == '\0') {
        cfd::core::GetElementsAddressFormatList();
        std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
        operator=(&addr_prefixes,&elements_prefixes);
        std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
        ~vector(&elements_prefixes);
      }
      cfd::core::Address::GetAddress_abi_cxx11_();
      pAVar27 = elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (elements_prefixes.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&elements_prefixes.
                    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(elements_prefixes.
                        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (pAVar27 != (pointer)0x0) {
        p_Var7 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT71(addr_prefixes.
                             super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             addr_prefixes.
                             super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_1_);
        p_Var9 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)addr_prefixes.
                    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        for (this = p_Var7;
            (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)addr_prefixes.
               super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
               ._M_impl.super__Vector_impl_data._M_finish != this; this = this + 1) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(this);
          p_Var9 = p_Var7;
        }
        addr_prefixes.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var9;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&elements_prefixes,
                   (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&utxo_data->field_0x208);
        std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
        emplace_back<cfd::core::AddressFormatData>
                  (&addr_prefixes,(AddressFormatData *)&elements_prefixes);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&elements_prefixes);
      }
      cfd::core::Descriptor::Parse((string *)&desc,(vector *)&utxo_data->descriptor);
      iVar22 = cfd::core::Descriptor::GetNeedArgumentNum();
      if (iVar22 == 0) {
        cfd::core::Descriptor::GetReferenceAll((vector *)&wit_size);
        cfd::core::DescriptorScriptReference::GetLockingScript();
        cfd::core::Script::operator=(&output.locking_script,(Script *)&elements_prefixes);
        core::Script::~Script((Script *)&elements_prefixes);
        cfd::core::Script::GetData();
        cfd::core::ByteData::GetBytes();
        pAVar25 = elements_prefixes.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pAVar27 = elements_prefixes.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        elements_prefixes.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        elements_prefixes.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        elements_prefixes.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if ((void *)CONCAT44(uStack_924,txin_size) != (void *)0x0) {
          operator_delete((void *)CONCAT44(uStack_924,txin_size));
        }
        iVar22 = cfd::core::DescriptorScriptReference::GetScriptType();
        if ((iVar22 != 10) ||
           (cVar20 = cfd::core::DescriptorScriptReference::HasAddress(), cVar20 != '\0')) {
          output.address_type = cfd::core::DescriptorScriptReference::GetAddressType();
          cfd::core::DescriptorScriptReference::GenerateAddress((NetType)&elements_prefixes);
          cfd::core::Address::operator=(&output.address,(Address *)&elements_prefixes);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_760);
          core::Script::~Script(&local_7a0);
          local_830[0] = cfd::core::Psbt::CheckTxInIndex;
          std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                    (&local_7b8);
          core::TapBranch::~TapBranch((TapBranch *)local_830);
          if (local_848 != (void *)0x0) {
            operator_delete(local_848);
          }
          if ((void *)local_888.map_._M_t._M_impl.super__Rb_tree_header._M_node_count != (void *)0x0
             ) {
            operator_delete((void *)local_888.map_._M_t._M_impl.super__Rb_tree_header._M_node_count)
            ;
          }
          if (local_888.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
              (_Base_ptr)0x0) {
            operator_delete(local_888.map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
          }
          if (elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != &local_888) {
            operator_delete(elements_prefixes.
                            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          cVar20 = cfd::core::DescriptorScriptReference::HasRedeemScript();
          if (cVar20 != '\0') {
            cfd::core::DescriptorScriptReference::GetRedeemScript();
            cfd::core::Script::operator=(&output.redeem_script,(Script *)&elements_prefixes);
            core::Script::~Script((Script *)&elements_prefixes);
          }
        }
        utxo->address_type = (undefined2)output.address_type;
        std::
        vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
        ::~vector((vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                   *)&wit_size);
      }
      else {
        pAVar27 = (pointer)0x0;
        pAVar25 = (pointer)0x0;
      }
      core::DescriptorNode::~DescriptorNode((DescriptorNode *)&desc);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector(&addr_prefixes);
    }
    if (pAVar27 == pAVar25) {
      cfd::core::Address::GetAddress_abi_cxx11_();
      pAVar18 = elements_prefixes.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (elements_prefixes.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&elements_prefixes.
                    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(elements_prefixes.
                        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (pAVar18 == (pointer)0x0) {
        cVar20 = cfd::core::Script::IsEmpty();
        if (cVar20 == '\0') {
          cfd::core::Script::GetData();
          cfd::core::ByteData::GetBytes();
          pAVar25 = elements_prefixes.
                    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pAVar18 = elements_prefixes.
                    super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          elements_prefixes.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          elements_prefixes.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          elements_prefixes.
          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (pAVar27 != (pointer)0x0) {
            operator_delete(pAVar27);
          }
          if (elements_prefixes.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(elements_prefixes.
                            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (_desc != (undefined8 *)0x0) {
            operator_delete(_desc);
          }
          cVar20 = cfd::core::Script::IsP2wpkhScript();
          if (cVar20 == '\0') {
            cVar20 = cfd::core::Script::IsP2wshScript();
            if (cVar20 == '\0') {
              cVar20 = cfd::core::Script::IsP2pkhScript();
              if (cVar20 == '\0') {
                cVar20 = cfd::core::Script::IsTaprootScript();
                if (cVar20 == '\0') {
                  cVar20 = cfd::core::Script::IsWitnessProgram();
                  if (cVar20 == '\0') {
                    bVar21 = false;
                  }
                  else {
                    cfd::core::Script::GetElementList();
                    lVar24 = cfd::core::ScriptElement::GetNumber();
                    bVar21 = lVar24 != 0;
                    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ::~vector((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               *)&elements_prefixes);
                  }
                  if (bVar21) {
                    utxo->address_type = 8;
                  }
                  else {
                    utxo->address_type = 1;
                  }
                }
                else {
                  utxo->address_type = 7;
                }
              }
              else {
                utxo->address_type = 2;
              }
            }
            else {
              utxo->address_type = 3;
            }
          }
          else {
            utxo->address_type = 4;
          }
          output.address_type = (AddressType)utxo->address_type;
          pAVar27 = pAVar18;
        }
      }
      else {
        cfd::core::Address::GetLockingScript();
        cfd::core::Script::operator=(&output.locking_script,(Script *)&elements_prefixes);
        core::Script::~Script((Script *)&elements_prefixes);
        cfd::core::Script::GetData();
        cfd::core::ByteData::GetBytes();
        pAVar25 = elements_prefixes.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pAVar18 = elements_prefixes.
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        elements_prefixes.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        elements_prefixes.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        elements_prefixes.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pAVar27 != (pointer)0x0) {
          operator_delete(pAVar27);
        }
        if (elements_prefixes.
            super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(elements_prefixes.
                          super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (_desc != (undefined8 *)0x0) {
          operator_delete(_desc);
        }
        if ((output._196_4_ != 1) || (1 < output.address_type - kP2shP2wshAddress)) {
          output.address_type = output._196_4_;
        }
        utxo->address_type = (undefined2)output.address_type;
        pAVar27 = pAVar18;
      }
    }
    if (pAVar27 != pAVar25) {
      uVar26 = (long)pAVar25 - (long)pAVar27;
      utxo->script_length = (uint16_t)uVar26;
      if (((uint)uVar26 & 0xfff8) < 0x28) {
        memcpy(utxo->locking_script,pAVar27,uVar26 & 0xffff);
      }
    }
    wit_size._0_2_ = 0;
    wit_size._2_2_ = 0;
    txin_size = 0;
    cVar20 = cfd::core::Script::IsEmpty();
    pSVar28 = &output.scriptsig_template;
    if (cVar20 != '\0') {
      pSVar28 = (Script *)0x0;
    }
    pUVar29 = dest;
    cVar20 = cfd::core::ConfidentialAssetId::IsEmpty();
    iVar22 = (int)pUVar29;
    if (cVar20 == '\0') {
      cfd::core::ConfidentialAssetId::GetData();
      cfd::core::ByteData::GetBytes();
      if ((void *)CONCAT71(addr_prefixes.
                           super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,
                           addr_prefixes.
                           super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
        operator_delete((void *)CONCAT71(addr_prefixes.
                                         super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                         addr_prefixes.
                                         super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_1_));
      }
      utxo->asset[0x20] = *(uint8_t *)(_desc + 4);
      uVar1 = *_desc;
      uVar3 = _desc[1];
      uVar4 = _desc[3];
      *(undefined8 *)(utxo->asset + 0x10) = _desc[2];
      *(undefined8 *)(utxo->asset + 0x18) = uVar4;
      *(undefined8 *)utxo->asset = uVar1;
      *(undefined8 *)(utxo->asset + 8) = uVar3;
      bVar21 = (bool)cfd::core::ConfidentialAssetId::HasBlinding();
      AVar19 = output.address_type;
      utxo->blinded = bVar21;
      cfd::core::Script::Script(&local_6c0,&output.redeem_script);
      cfd::core::Script::Script(&local_6f8);
      SVar5.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)&txin_size;
      SVar5._vptr_Script = (_func_int **)&wit_size;
      SVar5.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      SVar5.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pSVar28;
      SVar5.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      SVar5.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x34;
      SVar5.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      auVar8._4_4_ = uStack_924;
      auVar8._0_4_ = txin_size;
      auVar8._8_16_ = auStack_920;
      auVar8._24_2_ = (uint16_t)wit_size;
      auVar8._26_2_ = wit_size._2_2_;
      auVar8._28_20_ = auStack_90c;
      auVar8._48_8_ = 0;
      cfd::core::ConfidentialTxIn::EstimateTxInSize
                (AVar19,SVar5,(uint)&local_6c0,(Script)(auVar8 << 0x40),false,SUB81(&local_6f8,0),
                 (uint *)0x0,(uint *)0x0,
                 (bool)addr_prefixes.
                       super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_1_,
                 (Script *)
                 addr_prefixes.
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (int)addr_prefixes.
                      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,iVar22,
                 (uint *)txid.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                 (uint)txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
      core::Script::~Script(&local_6f8);
      core::Script::~Script(&local_6c0);
      txin_size = txin_size - 0x29;
      utxo->witness_size_max = (uint16_t)wit_size;
      utxo->uscript_size_max = (uint16_t)txin_size;
      if (_desc != (undefined8 *)0x0) {
        operator_delete(_desc);
      }
    }
    AVar19 = output.address_type;
    if (txin_size == 0 && CONCAT22(wit_size._2_2_,(uint16_t)wit_size) == 0) {
      wit_size._0_2_ = 0;
      wit_size._2_2_ = 0;
      txin_size = 0;
      cfd::core::Script::Script(&local_730,&output.redeem_script);
      SVar6._vptr_Script._4_4_ = uStack_924;
      SVar6._vptr_Script._0_4_ = txin_size;
      SVar6.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_920._0_8_;
      SVar6.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_920._8_8_;
      SVar6.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = (uint16_t)wit_size;
      SVar6.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._2_2_ = wit_size._2_2_;
      SVar6._28_20_ = auStack_90c;
      SVar6.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ =
           addr_prefixes.
           super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
           ._M_impl.super__Vector_impl_data._M_start._0_1_;
      SVar6.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ =
           addr_prefixes.
           super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
           ._M_impl.super__Vector_impl_data._M_start._1_7_;
      cfd::core::TxIn::EstimateTxInSize
                (AVar19,SVar6,(uint *)&local_730,&wit_size,(Script *)&txin_size);
      core::Script::~Script(&local_730);
      txin_size = txin_size - 0x29;
      utxo->witness_size_max = (uint16_t)wit_size;
      utxo->uscript_size_max = (uint16_t)txin_size;
    }
    if (dest != (UtxoData *)0x0) {
      UtxoData::operator=(dest,&output);
    }
    if (pAVar27 != (pointer)0x0) {
      operator_delete(pAVar27);
    }
    if (txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(txid.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (block_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(block_hash.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    UtxoData::~UtxoData(&output);
  }
  return;
}

Assistant:

void UtxoUtil::ConvertToUtxo(
    const UtxoData& utxo_data, Utxo* utxo, UtxoData* dest) {
  if (utxo != nullptr) {
    UtxoData output(utxo_data);
    memset(utxo, 0, sizeof(Utxo));
    utxo->block_height = utxo_data.block_height;
    utxo->vout = utxo_data.vout;
    utxo->binary_data = utxo_data.binary_data;
    utxo->amount = utxo_data.amount.GetSatoshiValue();

    ByteData block_hash = utxo_data.block_hash.GetData();
    if (!block_hash.Empty()) {
      memcpy(
          utxo->block_hash, block_hash.GetBytes().data(),
          sizeof(utxo->block_hash));
    }
    ByteData txid = utxo_data.txid.GetData();
    if (!txid.Empty()) {
      memcpy(utxo->txid, txid.GetBytes().data(), sizeof(utxo->txid));
    }

    // convert from descriptor
    std::vector<uint8_t> locking_script_bytes;
    if (!utxo_data.descriptor.empty()) {
      NetType net_type = NetType::kMainnet;
      std::vector<AddressFormatData> addr_prefixes =
          cfd::core::GetBitcoinAddressFormatList();
#ifndef CFD_DISABLE_ELEMENTS
      if (!utxo_data.asset.IsEmpty()) {
        std::vector<AddressFormatData> elements_prefixes =
            cfd::core::GetElementsAddressFormatList();
        addr_prefixes = elements_prefixes;
        net_type = NetType::kLiquidV1;
      }
#endif  // CFD_DISABLE_ELEMENTS
      if (!utxo_data.address.GetAddress().empty()) {
        addr_prefixes.clear();
        addr_prefixes.push_back(utxo_data.address.GetAddressFormatData());
        net_type = utxo_data.address.GetNetType();
      }

      Descriptor desc =
          Descriptor::Parse(utxo_data.descriptor, &addr_prefixes);
      if (desc.GetNeedArgumentNum() == 0) {
        std::vector<DescriptorScriptReference> ref_list =
            desc.GetReferenceAll();
        DescriptorScriptReference& script_ref = ref_list[0];
        output.locking_script = script_ref.GetLockingScript();
        locking_script_bytes = output.locking_script.GetData().GetBytes();
        if ((script_ref.GetScriptType() !=
             DescriptorScriptType::kDescriptorScriptRaw) ||
            script_ref.HasAddress()) {
          output.address_type = script_ref.GetAddressType();
          output.address = script_ref.GenerateAddress(net_type);
          if (ref_list[ref_list.size() - 1].HasRedeemScript()) {
            output.redeem_script =
                ref_list[ref_list.size() - 1].GetRedeemScript();
          }
        }
        utxo->address_type = static_cast<uint16_t>(output.address_type);
      }
    }

    if (!locking_script_bytes.empty()) {
      // do nothing
    } else if (!output.address.GetAddress().empty()) {
      output.locking_script = output.address.GetLockingScript();
      locking_script_bytes = output.locking_script.GetData().GetBytes();
      AddressType addr_type = output.address.GetAddressType();
      if ((addr_type == AddressType::kP2shAddress) &&
          ((output.address_type == AddressType::kP2shP2wshAddress) ||
           (output.address_type == AddressType::kP2shP2wpkhAddress))) {
        // direct set. output.address_type;
      } else {
        output.address_type = addr_type;
      }
      utxo->address_type = static_cast<uint16_t>(output.address_type);
    } else if (!utxo_data.locking_script.IsEmpty()) {
      locking_script_bytes = utxo_data.locking_script.GetData().GetBytes();
      if (utxo_data.locking_script.IsP2wpkhScript()) {
        utxo->address_type = AddressType::kP2wpkhAddress;
      } else if (utxo_data.locking_script.IsP2wshScript()) {
        utxo->address_type = AddressType::kP2wshAddress;
      } else if (utxo_data.locking_script.IsP2pkhScript()) {
        utxo->address_type = AddressType::kP2pkhAddress;
      } else if (utxo_data.locking_script.IsTaprootScript()) {
        utxo->address_type = AddressType::kTaprootAddress;
      } else if (
          utxo_data.locking_script.IsWitnessProgram() &&
          (utxo_data.locking_script.GetElementList()[0].GetNumber() != 0)) {
        utxo->address_type = AddressType::kWitnessUnknown;
      } else {  // TODO(k-matsuzawa): unbknown type is convert to p2sh
        utxo->address_type = AddressType::kP2shAddress;
      }
      output.address_type = static_cast<AddressType>(utxo->address_type);
    }

    if (!locking_script_bytes.empty()) {
      utxo->script_length = static_cast<uint16_t>(locking_script_bytes.size());
      if (utxo->script_length < sizeof(utxo->locking_script)) {
        memcpy(
            utxo->locking_script, locking_script_bytes.data(),
            utxo->script_length);
      }
    }

    uint32_t wit_size = 0;
    uint32_t txin_size = 0;
    const Script* scriptsig_template = nullptr;
    if (!output.scriptsig_template.IsEmpty()) {
      scriptsig_template = &output.scriptsig_template;
    }

#ifndef CFD_DISABLE_ELEMENTS
    if (!utxo_data.asset.IsEmpty()) {
      std::vector<uint8_t> asset = utxo_data.asset.GetData().GetBytes();
      memcpy(utxo->asset, asset.data(), sizeof(utxo->asset));
      utxo->blinded = utxo_data.asset.HasBlinding();

      ConfidentialTxIn::EstimateTxInSize(
          output.address_type, output.redeem_script, 0, Script(), false, false,
          &wit_size, &txin_size, false, scriptsig_template);
      txin_size -= static_cast<uint32_t>(TxIn::kMinimumTxInSize);
      utxo->witness_size_max = static_cast<uint16_t>(wit_size);
      utxo->uscript_size_max = static_cast<uint16_t>(txin_size);
    }
#endif  // CFD_DISABLE_ELEMENTS

    if ((wit_size == 0) && (txin_size == 0)) {
      wit_size = 0;
      txin_size = 0;
      TxIn::EstimateTxInSize(
          output.address_type, output.redeem_script, &wit_size, &txin_size,
          scriptsig_template);
      txin_size -= static_cast<uint32_t>(TxIn::kMinimumTxInSize);
      utxo->witness_size_max = static_cast<uint16_t>(wit_size);
      utxo->uscript_size_max = static_cast<uint16_t>(txin_size);
    }

    if (dest != nullptr) {
      *dest = output;
    }
  }
}